

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O1

int leave_span_callback(MD_SPANTYPE type,void *detail,void *userdata)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  
  if (type == MD_SPAN_IMG) {
    *(int *)((long)userdata + 0x14) = *(int *)((long)userdata + 0x14) + -1;
  }
  if (0 < *(int *)((long)userdata + 0x14)) {
    return 0;
  }
  switch(type) {
  case MD_SPAN_EM:
    uVar1 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</em>";
    iVar3 = 5;
    break;
  case MD_SPAN_STRONG:
    uVar1 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</strong>";
    iVar3 = 9;
    break;
  case MD_SPAN_A:
    uVar1 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</a>";
    goto LAB_0010d7f8;
  case MD_SPAN_IMG:
    if (*(long *)((long)detail + 0x20) != 0) {
      (**userdata)("\" title=\"",9,*(undefined8 *)((long)userdata + 8));
      render_attribute((MD_HTML *)userdata,(MD_ATTRIBUTE *)((long)detail + 0x20),render_html_escaped
                      );
    }
    uVar2 = *(uint *)((long)userdata + 0x10) & 8;
    pcVar4 = "\" />";
    if (uVar2 == 0) {
      pcVar4 = "\">";
    }
    iVar3 = (uVar2 >> 2) + 2;
    uVar1 = *(undefined8 *)((long)userdata + 8);
    break;
  case MD_SPAN_CODE:
    uVar1 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</code>";
    iVar3 = 7;
    break;
  case MD_SPAN_DEL:
    uVar1 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</del>";
    iVar3 = 6;
    break;
  case MD_SPAN_LATEXMATH:
  case MD_SPAN_LATEXMATH_DISPLAY:
    uVar1 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</x-equation>";
    goto LAB_0010d896;
  case MD_SPAN_WIKILINK:
    uVar1 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</x-wikilink>";
LAB_0010d896:
    iVar3 = 0xd;
    break;
  case MD_SPAN_U:
    uVar1 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "</u>";
LAB_0010d7f8:
    iVar3 = 4;
    break;
  default:
    goto switchD_0010d7b9_default;
  }
  (**userdata)(pcVar4,iVar3,uVar1);
switchD_0010d7b9_default:
  return 0;
}

Assistant:

static int
leave_span_callback(MD_SPANTYPE type, void* detail, void* userdata)
{
    MD_HTML* r = (MD_HTML*) userdata;

    if(type == MD_SPAN_IMG)
        r->image_nesting_level--;
    if(r->image_nesting_level > 0)
        return 0;

    switch(type) {
        case MD_SPAN_EM:                RENDER_VERBATIM(r, "</em>"); break;
        case MD_SPAN_STRONG:            RENDER_VERBATIM(r, "</strong>"); break;
        case MD_SPAN_U:                 RENDER_VERBATIM(r, "</u>"); break;
        case MD_SPAN_A:                 RENDER_VERBATIM(r, "</a>"); break;
        case MD_SPAN_IMG:               render_close_img_span(r, (MD_SPAN_IMG_DETAIL*) detail); break;
        case MD_SPAN_CODE:              RENDER_VERBATIM(r, "</code>"); break;
        case MD_SPAN_DEL:               RENDER_VERBATIM(r, "</del>"); break;
        case MD_SPAN_LATEXMATH:         /*fall through*/
        case MD_SPAN_LATEXMATH_DISPLAY: RENDER_VERBATIM(r, "</x-equation>"); break;
        case MD_SPAN_WIKILINK:          RENDER_VERBATIM(r, "</x-wikilink>"); break;
    }

    return 0;
}